

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

void __thiscall CWire::ClearSegmentList(CWire *this)

{
  pointer ppCVar1;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iIndex;
  
  iVar3 = (int)((ulong)((long)(this->m_SegmentList).
                              super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_SegmentList).
                             super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  if (0 < iVar3) {
    iIndex = 0;
    do {
      pvVar2 = GetSegmentList(this,iIndex);
      uVar4 = (uint)((ulong)((long)(pvVar2->
                                   super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar2->
                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          CSegment::Delete((pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar5);
      }
      ppCVar1 = (pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppCVar1) {
        (pvVar2->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = ppCVar1;
      }
      iIndex = iIndex + 1;
    } while (iIndex != iVar3);
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
  ::_M_erase_at_end(&this->m_SegmentList,
                    (this->m_SegmentList).
                    super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  return;
}

Assistant:

void CWire::ClearSegmentList()
{
	int	iNumSegmentList	=	GetNumSegmentList();

	for (int i=0;i<iNumSegmentList;++i)
	{
		vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
		for (int j=0,s=pSegmentList->size();j<s;++j)
		{
			(*pSegmentList)[j]->Delete();//SAFE_DEL((*pSegmentList)[j]);
		}

		pSegmentList->clear();
	}

	m_SegmentList.clear();
	m_pRoutedSegmentList	=	NULL;
}